

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

void __thiscall cmCTestGIT::CommitParser::DoBodyLine(CommitParser *this)

{
  ulong uVar1;
  string local_30 [32];
  CommitParser *local_10;
  CommitParser *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::size();
  if (3 < uVar1) {
    std::__cxx11::string::substr
              ((ulong)local_30,(ulong)&(this->super_DiffParser).super_LineParser.Line);
    std::__cxx11::string::operator+=((string *)&(this->Rev).Log,local_30);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::operator+=((string *)&(this->Rev).Log,"\n");
  return;
}

Assistant:

void DoBodyLine()
  {
    // Commit log lines are indented by 4 spaces.
    if (this->Line.size() >= 4) {
      this->Rev.Log += this->Line.substr(4);
    }
    this->Rev.Log += "\n";
  }